

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook>_> __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::extractCap(MembraneCapTableBuilder *this,uint index)

{
  ClientHook *pCVar1;
  ClientHook *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  Maybe<kj::Own<capnp::ClientHook>_> MVar3;
  Own<capnp::ClientHook> local_48;
  Own<capnp::ClientHook> local_38;
  Own<capnp::ClientHook> local_28;
  
  lVar2 = CONCAT44(in_register_00000034,index);
  (**(code **)**(undefined8 **)(lVar2 + 8))(&local_48);
  pCVar1 = local_48.ptr;
  if (local_48.ptr == (ClientHook *)0x0) {
    (this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader = (_func_int **)0x0;
    this->inner = (CapTableBuilder *)0x0;
  }
  else {
    local_48.ptr = (ClientHook *)0x0;
    local_38.disposer = local_48.disposer;
    local_38.ptr = pCVar1;
    membrane((anon_unknown_0 *)&local_28,&local_38,*(MembranePolicy **)(lVar2 + 0x10),
             *(bool *)(lVar2 + 0x18));
    kj::Own<capnp::ClientHook>::dispose(&local_38);
    (this->super_CapTableBuilder).super_CapTableReader._vptr_CapTableReader =
         (_func_int **)local_28.disposer;
    this->inner = (CapTableBuilder *)local_28.ptr;
    local_28.ptr = (ClientHook *)0x0;
    kj::Own<capnp::ClientHook>::dispose(&local_28);
  }
  kj::Own<capnp::ClientHook>::dispose(&local_48);
  MVar3.ptr.ptr = extraout_RDX;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> extractCap(uint index) override {
    // The underlying message is inside the membrane, and we're pulling a cap out of it. Therefore,
    // we want to wrap the extracted capability in the membrane.
    return inner->extractCap(index).map([this](kj::Own<ClientHook>&& cap) {
      return membrane(kj::mv(cap), policy, reverse);
    });
  }